

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O1

double __thiscall OpenMD::Polynomial<double>::evaluate(Polynomial<double> *this,double *x)

{
  double dVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_color _Var3;
  _Rb_tree_header *p_Var4;
  double dVar5;
  double local_18;
  
  p_Var2 = (this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var4) {
    local_18 = 0.0;
  }
  else {
    dVar1 = *x;
    local_18 = 0.0;
    do {
      _Var3 = p_Var2[1]._M_color;
      dVar5 = 1.0;
      if (0 < (int)_Var3) {
        dVar5 = 1.0;
        do {
          dVar5 = dVar5 * dVar1;
          _Var3 = _Var3 - _S_black;
        } while (_Var3 != _S_red);
      }
      local_18 = local_18 + dVar5 * (double)p_Var2[1]._M_parent;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
  }
  return local_18;
}

Assistant:

Real evaluate(const Real& x) {
      Real result = Real();
      ExponentType exponent;
      CoefficientType coefficient;

      for (iterator i = polyPairMap_.begin(); i != polyPairMap_.end(); ++i) {
        exponent    = i->first;
        coefficient = i->second;
        result += fastpow(x, exponent) * coefficient;
      }

      return result;
    }